

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_draw.cxx
# Opt level: O3

char * expand_text_(char *from,char **buf,int maxbuf,double maxw,int *n,double *width,int wrap,
                   int draw_symbols)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  byte *__s;
  char *pcVar7;
  byte *pbVar8;
  size_t __size;
  byte *pbVar9;
  double extraout_XMM0_Qa;
  double dVar10;
  double extraout_XMM0_Qa_00;
  byte *local_68;
  double local_60;
  
  pcVar7 = *buf + maxbuf;
  underline_at = (char *)0x0;
  if (expand_text_(char_const*,char*&,int,double,int&,double&,int,int)::local_buf == '\0') {
    expand_text_();
  }
  pbVar5 = (byte *)expand_text_::local_buf;
  if (maxbuf == 0) {
    *buf = expand_text_::local_buf;
    pcVar7 = (char *)pbVar5 + expand_text_::l_local_buff;
  }
  else {
    pbVar5 = (byte *)*buf;
  }
  pbVar8 = (byte *)(pcVar7 + -4);
  local_60 = 0.0;
  __s = pbVar5;
  pbVar9 = (byte *)from;
  do {
    bVar1 = *from;
    pbVar6 = pbVar5;
    if (((ulong)bVar1 < 0x21) && ((0x100000401U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
      dVar10 = local_60;
      if ((wrap != 0) && (pbVar9 < from)) {
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x37])
                  (fl_graphics_driver,pbVar5,(ulong)(uint)((int)__s - (int)pbVar5));
        dVar10 = extraout_XMM0_Qa + local_60;
        pbVar6 = __s;
        if ((*buf < pbVar5) && (pbVar4 = pbVar5, local_68 = pbVar9, maxw < dVar10))
        goto LAB_001e99f9;
      }
      pbVar5 = pbVar6;
      pbVar4 = __s;
      local_68 = (byte *)from;
      local_60 = dVar10;
      if (bVar1 == 0) goto LAB_001e99f9;
      if (bVar1 == 10) {
        local_68 = (byte *)from + 1;
LAB_001e99f9:
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x37])
                  (fl_graphics_driver,pbVar5,(ulong)(uint)((int)pbVar4 - (int)pbVar5));
        *width = extraout_XMM0_Qa_00 + local_60;
        *pbVar4 = 0;
        *n = (int)pbVar4 - *(int *)buf;
        return (char *)local_68;
      }
      pbVar9 = (byte *)from + 1;
    }
    pcVar7 = expand_text_::local_buf;
    pbVar5 = pbVar6;
    if (pbVar8 < __s) {
      pbVar4 = __s;
      local_68 = (byte *)from;
      if (maxbuf != 0) goto LAB_001e99f9;
      expand_text_::l_local_buff = ((int)__s - (int)pbVar8) + expand_text_::l_local_buff + 200;
      __size = (size_t)expand_text_::l_local_buff;
      expand_text_::local_buf = (char *)realloc(expand_text_::local_buf,__size);
      *buf = expand_text_::local_buf;
      pbVar8 = (byte *)(expand_text_::local_buf + (__size - 4));
      __s = (byte *)(expand_text_::local_buf + ((long)__s - (long)pcVar7));
      pbVar5 = (byte *)(expand_text_::local_buf + ((long)pbVar6 - (long)pcVar7));
    }
    if (bVar1 == 9) {
      uVar2 = fl_utf_nb_char((uchar *)*buf,(int)__s - (int)*buf);
      if (__s < pbVar8) {
        uVar3 = uVar2 + 7;
        if (-1 < (int)uVar2) {
          uVar3 = uVar2;
        }
        pbVar4 = (byte *)(ulong)(((uVar3 & 0xfffffff8) - uVar2) + 7);
        pbVar6 = pbVar8 + ~(ulong)__s;
        if (pbVar4 <= pbVar8 + ~(ulong)__s) {
          pbVar6 = pbVar4;
        }
        memset(__s,0x20,(size_t)(pbVar6 + 1));
        __s = __s + (long)pbVar6 + 1;
      }
    }
    else if ((fl_draw_shortcut == '\0' || bVar1 != 0x26) || (((byte *)from)[1] == 0)) {
      if (bVar1 < 0x20 || bVar1 == 0x7f) {
        *__s = 0x5e;
        __s[1] = bVar1 ^ 0x40;
        __s = __s + 2;
      }
      else {
        if ((draw_symbols == 0) || (bVar1 != 0x40)) {
          *__s = bVar1;
          goto LAB_001e99ce;
        }
        pbVar4 = __s;
        local_68 = (byte *)from;
        if ((((byte *)from)[1] & 0xbf) != 0) goto LAB_001e99f9;
        *__s = 0x40;
        __s = __s + 1;
        if (((byte *)from)[1] != 0) {
          from = (char *)((byte *)from + 1);
        }
      }
    }
    else if (((byte *)from)[1] == 0x26) {
      from = (char *)((byte *)from + 1);
      *__s = 0x26;
LAB_001e99ce:
      __s = __s + 1;
    }
    else if (fl_draw_shortcut != '\x02') {
      underline_at = (char *)__s;
    }
    from = (char *)((byte *)from + 1);
  } while( true );
}

Assistant:

static const char* expand_text_(const char* from, char*& buf, int maxbuf, double maxw, int& n,
	       double &width, int wrap, int draw_symbols) {
  char* e = buf+(maxbuf-4);
  underline_at = 0;
  double w = 0;
  static int l_local_buff = 500;
  static char *local_buf = (char*)malloc(l_local_buff); // initial buffer allocation
  if (maxbuf == 0) {
    buf = local_buf;
    e = buf + l_local_buff - 4;
    }
  char* o = buf;
  char* word_end = o;
  const char* word_start = from;

  const char* p = from;
  for (;; p++) {

    int c = *p & 255;

    if (!c || c == ' ' || c == '\n') {
      // test for word-wrap:
      if (word_start < p && wrap) {
	double newwidth = w + fl_width(word_end, (int) (o-word_end) );
	if (word_end > buf && newwidth > maxw) { // break before this word
	  o = word_end;
	  p = word_start;
	  break;
	}
	word_end = o;
	w = newwidth;
      }
      if (!c) break;
      else if (c == '\n') {p++; break;}
      word_start = p+1;
    }

    if (o > e) {
      if (maxbuf) break; // don't overflow buffer
      l_local_buff += (o - e) + 200; // enlarge buffer
      buf = (char*)realloc(local_buf, l_local_buff);
      e = buf + l_local_buff - 4; // update pointers to buffer content
      o = buf + (o - local_buf);
      word_end = buf + (word_end - local_buf);
      local_buf = buf;
    }

    if (c == '\t') {
      for (c = fl_utf_nb_char((uchar*)buf, (int) (o-buf) )%8; c<8 && o<e; c++)
           *o++ = ' ';
    } else if (c == '&' && fl_draw_shortcut && *(p+1)) {
      if (*(p+1) == '&') {p++; *o++ = '&';}
      else if (fl_draw_shortcut != 2) underline_at = o;
    } else if (c < ' ' || c == 127) { // ^X
      *o++ = '^';
      *o++ = c ^ 0x40;
/* This is in fact not useful: the point is that a valid UTF-8 sequence for a non-ascii char contains no ascii char,
 thus no tab, space, control, & or @ we want to process differently.
 Also, invalid UTF-8 sequences are copied unchanged by this procedure.
 Therefore, checking for tab, space, control, & or @, and copying the byte otherwise, is enough.
 } else  if (handle_utf8_seq(p, o)) { // figure out if we have an utf8 valid sequence before we determine the nbsp test validity:
#ifdef __APPLE__
    } else if (c == 0xCA) { // non-breaking space in MacRoman
#else
    } else if (c == 0xA0) { // non-breaking space in ISO 8859
#endif
      *o++ = ' ';*/
    } else if (c == '@' && draw_symbols) { // Symbol???
      if (p[1] && p[1] != '@')  break;
      *o++ = c;
      if (p[1]) p++;
    } else {
      *o++ = c;
    }
  }

  width = w + fl_width(word_end, (int) (o-word_end));
  *o = 0;
  n = (int) (o-buf);
  return p;
}